

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::setViewFromJson(string *jsonData,bool flyTo)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  size_type sVar4;
  col_type *this;
  float *pfVar5;
  byte in_SIL;
  string *in_RDI;
  string projectionModeStr;
  int j_1;
  int i;
  iterator it;
  value_type matData;
  stringstream s;
  json j;
  int windowHeight;
  int windowWidth;
  double newFarClipRatio;
  double newNearClipRatio;
  double newFov;
  mat4 newViewMat;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined2 in_stack_fffffffffffffa14;
  byte in_stack_fffffffffffffa16;
  byte in_stack_fffffffffffffa17;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  key_type *in_stack_fffffffffffffa30;
  key_type *key;
  undefined4 in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffa48;
  ProjectionMode mode;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  reference in_stack_fffffffffffffab8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffac0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  float in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  reference in_stack_fffffffffffffb00;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [71];
  undefined1 local_459 [65];
  undefined1 local_418 [39];
  allocator local_3f1;
  string local_3f0 [103];
  allocator local_389;
  string local_388 [103];
  allocator local_321;
  string local_320 [64];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2e0 [2];
  allocator local_2b9;
  string local_2b8 [96];
  int local_258;
  int local_254;
  int local_22c;
  stringstream local_208 [408];
  int local_70;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  mat<4,_4,_float,_(glm::qualifier)0> local_4c;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_58 = -777.0;
  local_60 = -777.0;
  local_68 = -777.0;
  local_6c = view::windowWidth;
  local_70 = view::windowHeight;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT17(in_stack_fffffffffffffa17,
                           CONCAT16(in_stack_fffffffffffffa16,
                                    CONCAT24(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10))),
               in_stack_fffffffffffffa08);
  _Var3 = geometrycentral::surface::std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_208,in_RDI,_Var3);
  nlohmann::operator>>
            ((istream *)in_stack_fffffffffffffb00,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
               in_stack_fffffffffffffa48);
  sVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffa18);
  if (sVar4 == 0x10) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)in_stack_fffffffffffffa18);
    for (local_254 = 0; local_254 < 4; local_254 = local_254 + 1) {
      for (local_258 = 0; local_258 < 4; local_258 = local_258 + 1) {
        in_stack_fffffffffffffb00 =
             nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
        in_stack_fffffffffffffafc =
             nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator_float<float,_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)0x3df378);
        this = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](&local_4c,local_258);
        pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](this,local_254);
        *pfVar5 = in_stack_fffffffffffffafc;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(in_stack_fffffffffffffa18,
                     CONCAT13(in_stack_fffffffffffffa17,
                              CONCAT12(in_stack_fffffffffffffa16,in_stack_fffffffffffffa14)));
      }
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    local_58 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator_double<double,_0>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)0x3df461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"nearClipRatio",&local_2b9);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::find((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
           in_stack_fffffffffffffa30);
    this_00 = local_2e0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa18);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa17,
                                     CONCAT16(in_stack_fffffffffffffa16,
                                              CONCAT24(in_stack_fffffffffffffa14,
                                                       in_stack_fffffffffffffa10))),
                         in_stack_fffffffffffffa08);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    if (bVar1) {
      in_stack_fffffffffffffab8 =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffab8);
      local_60 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator_double<double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)0x3df560);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"farClipRatio",&local_321);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::find((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
           in_stack_fffffffffffffa30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa18);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa17,
                                     CONCAT16(in_stack_fffffffffffffa16,
                                              CONCAT24(in_stack_fffffffffffffa14,
                                                       in_stack_fffffffffffffa10))),
                         in_stack_fffffffffffffa08);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffab8);
      local_68 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator_double<double,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)0x3df6aa);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"windowWidth",&local_389);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::find((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
           in_stack_fffffffffffffa30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa18);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa17,
                                     CONCAT16(in_stack_fffffffffffffa16,
                                              CONCAT24(in_stack_fffffffffffffa14,
                                                       in_stack_fffffffffffffa10))),
                         in_stack_fffffffffffffa08);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffab8);
      local_6c = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator_int<int,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)0x3df7dc);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"windowHeight",&local_3f1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::find((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
           in_stack_fffffffffffffa30);
    mode = (ProjectionMode)((ulong)local_418 >> 0x20);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa18);
    bVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa17,
                                     CONCAT16(in_stack_fffffffffffffa16,
                                              CONCAT24(in_stack_fffffffffffffa14,
                                                       in_stack_fffffffffffffa10))),
                         in_stack_fffffffffffffa08);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    if ((bVar2 & 1) != 0) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffab8);
      in_stack_fffffffffffffa3c =
           nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator_int<int,_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)0x3df902);
      local_70 = in_stack_fffffffffffffa3c;
    }
    key = (key_type *)local_459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_459 + 1),"projectionMode",(allocator *)key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::find((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffa18);
    bVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT17(in_stack_fffffffffffffa17,
                                     CONCAT16(in_stack_fffffffffffffa16,
                                              CONCAT24(in_stack_fffffffffffffa14,
                                                       in_stack_fffffffffffffa10))),
                         in_stack_fffffffffffffa08);
    std::__cxx11::string::~string((string *)(local_459 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_459);
    if ((bVar2 & 1) != 0) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(this_00,(char *)in_stack_fffffffffffffab8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffa08);
      to_string_abi_cxx11_(mode);
      in_stack_fffffffffffffa17 =
           std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(bVar2,in_stack_fffffffffffffa28));
      std::__cxx11::string::~string(local_4c0);
      if ((in_stack_fffffffffffffa17 & 1) == 0) {
        to_string_abi_cxx11_(mode);
        in_stack_fffffffffffffa16 =
             std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(bVar2,in_stack_fffffffffffffa28));
        std::__cxx11::string::~string(local_4e0);
        if ((in_stack_fffffffffffffa16 & 1) != 0) {
          projectionMode = 1;
        }
      }
      else {
        projectionMode = 0;
      }
      std::__cxx11::string::~string(local_4a0);
    }
    local_22c = 0;
  }
  else {
    local_22c = 1;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)CONCAT17(in_stack_fffffffffffffa17,
                            CONCAT16(in_stack_fffffffffffffa16,
                                     CONCAT24(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)))
               );
  std::__cxx11::stringstream::~stringstream(local_208);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)CONCAT17(in_stack_fffffffffffffa17,
                            CONCAT16(in_stack_fffffffffffffa16,
                                     CONCAT24(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)))
               );
  if (local_22c == 0) {
    setWindowSize(0,0x3dfbf9);
    if (0.0 < local_60) {
      nearClipRatio = local_60;
    }
    if (0.0 < local_68) {
      farClipRatio = local_68;
    }
    if ((local_9 & 1) == 0) {
      memcpy(viewMat,&local_4c,0x40);
      fov = local_58;
      requestRedraw();
    }
    else {
      startFlightTo((mat4 *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                    in_stack_fffffffffffffaf8);
    }
  }
  return;
}

Assistant:

void setViewFromJson(std::string jsonData, bool flyTo) {
  // Values will go here
  glm::mat4 newViewMat;
  double newFov = -777;
  double newNearClipRatio = -777;
  double newFarClipRatio = -777;

  int windowWidth = view::windowWidth;
  int windowHeight = view::windowHeight;

  try {

    // Deserialize
    json j;
    std::stringstream s(jsonData);
    s >> j;

    // Read out the data
    auto matData = j["viewMat"];
    if (matData.size() != 16) return; // check size
    auto it = matData.begin();
    for (int i = 0; i < 4; i++) {
      for (int j = 0; j < 4; j++) {
        newViewMat[j][i] = *it;
        it++;
      }
    }
    newFov = j["fov"];

    // Get the clip ratios, but only if present
    if (j.find("nearClipRatio") != j.end()) {
      newNearClipRatio = j["nearClipRatio"];
    }
    if (j.find("farClipRatio") != j.end()) {
      newFarClipRatio = j["farClipRatio"];
    }

    // Get the window sizes, if present
    if (j.find("windowWidth") != j.end()) {
      windowWidth = j["windowWidth"];
    }
    if (j.find("windowHeight") != j.end()) {
      windowHeight = j["windowHeight"];
    }

    if (j.find("projectionMode") != j.end()) {
      std::string projectionModeStr = j["projectionMode"];
      if (projectionModeStr == to_string(ProjectionMode::Perspective)) {
        view::projectionMode = ProjectionMode::Perspective;
      } else if (projectionModeStr == to_string(ProjectionMode::Orthographic)) {
        view::projectionMode = ProjectionMode::Orthographic;
      }
    }

  } catch (...) {
    // If anything goes wrong parsing, just give up
    return;
  }

  // === Assign the new values

  view::setWindowSize(windowWidth, windowHeight);

  if (newNearClipRatio > 0) nearClipRatio = newNearClipRatio;
  if (newFarClipRatio > 0) farClipRatio = newFarClipRatio;

  if (flyTo) {
    startFlightTo(newViewMat, fov);
  } else {
    viewMat = newViewMat;
    fov = newFov;
    requestRedraw();
  }
}